

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O2

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::InitializePrototypes
          (JsBuiltInEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  PropertyId propertyId;
  JavascriptString *propertyName;
  Var pvVar2;
  DynamicObject *pDVar3;
  JavascriptFunction *ptr;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  propertyName = JavascriptString::NewWithSz(L"ArrayIterator",scriptContext);
  pDVar3 = (pJVar1->chakraLibraryObject).ptr;
  propertyId = JavascriptOperators::GetPropertyId(propertyName,scriptContext);
  pvVar2 = JavascriptOperators::GetProperty
                     (&pDVar3->super_RecyclableObject,propertyId,scriptContext,
                      (PropertyValueInfo *)0x0);
  pDVar3 = VarTo<Js::DynamicObject>(pvVar2);
  pvVar2 = JavascriptOperators::GetProperty
                     (&pDVar3->super_RecyclableObject,0x124,scriptContext,(PropertyValueInfo *)0x0);
  pDVar3 = VarTo<Js::DynamicObject>(pvVar2);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierSet
            (&(pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototype,pDVar3);
  pvVar2 = JavascriptOperators::GetProperty
                     (&((pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototype.ptr)->
                       super_RecyclableObject,0x107,scriptContext,(PropertyValueInfo *)0x0);
  ptr = VarTo<Js::JavascriptFunction>(pvVar2);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            (&(pJVar1->super_JavascriptLibraryBase).arrayIteratorPrototypeBuiltinNextFunction,ptr);
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::InitializePrototypes(ScriptContext * scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();
        JavascriptString * methodName = JavascriptString::NewWithSz(_u("ArrayIterator"), scriptContext);
        auto arrayIterator = JavascriptOperators::GetProperty(library->GetChakraLib(), JavascriptOperators::GetPropertyId(methodName, scriptContext), scriptContext);
        library->arrayIteratorPrototype = VarTo<DynamicObject>(JavascriptOperators::GetProperty(VarTo<DynamicObject>(arrayIterator), PropertyIds::prototype, scriptContext));
        library->arrayIteratorPrototypeBuiltinNextFunction = VarTo<JavascriptFunction>(JavascriptOperators::GetProperty(library->arrayIteratorPrototype, PropertyIds::next, scriptContext));
    }